

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TrackDescriptor * __thiscall
perfetto::CounterTrack::Serialize(TrackDescriptor *__return_storage_ptr__,CounterTrack *this)

{
  CounterDescriptor *this_00;
  allocator<char> local_59;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Track::Serialize(__return_storage_ptr__,&this->super_Track);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,this->name_,&local_59);
  protos::gen::TrackDescriptor::set_name(__return_storage_ptr__,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  this_00 = protos::gen::TrackDescriptor::mutable_counter(__return_storage_ptr__);
  if (this->category_ != (char *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,this->category_,(allocator<char> *)&local_58);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this_00->categories_,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  if (this->unit_ != CounterDescriptor_Unit_UNIT_UNSPECIFIED) {
    protos::gen::CounterDescriptor::set_unit(this_00,this->unit_);
  }
  if (this->type_ == CounterDescriptor_BuiltinCounterType_COUNTER_UNSPECIFIED) {
    if (this->unit_name_ != (char *)0x0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,this->unit_name_,&local_59);
      protos::gen::CounterDescriptor::set_unit_name(this_00,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    protos::gen::CounterDescriptor::set_type(this_00,this->type_);
  }
  if (this->unit_multiplier_ != 1) {
    protos::gen::CounterDescriptor::set_unit_multiplier(this_00,this->unit_multiplier_);
  }
  if (this->is_incremental_ == true) {
    protos::gen::CounterDescriptor::set_is_incremental(this_00,true);
  }
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor CounterTrack::Serialize() const {
  auto desc = Track::Serialize();
  desc.set_name(name_);
  auto* counter = desc.mutable_counter();
  if (category_)
    counter->add_categories(category_);
  if (unit_ != perfetto::protos::pbzero::CounterDescriptor::UNIT_UNSPECIFIED)
    counter->set_unit(static_cast<protos::gen::CounterDescriptor_Unit>(unit_));
  {
    // if |type| is set, we don't want to emit |unit_name|. Trace processor
    // infers the track name from the type in that case.
    if (type_ !=
        perfetto::protos::gen::CounterDescriptor::COUNTER_UNSPECIFIED) {
      counter->set_type(type_);
    } else if (unit_name_) {
      counter->set_unit_name(unit_name_);
    }
  }
  if (unit_multiplier_ != 1)
    counter->set_unit_multiplier(unit_multiplier_);
  if (is_incremental_)
    counter->set_is_incremental(is_incremental_);
  return desc;
}